

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int osLocaltime(time_t *t,tm *pTm)

{
  int iVar1;
  sqlite3_mutex *p;
  sqlite3_mutex *mutex;
  tm *pX;
  int rc;
  tm *pTm_local;
  time_t *t_local;
  
  p = sqlite3MutexAlloc(2);
  sqlite3_mutex_enter(p);
  mutex = (sqlite3_mutex *)localtime(t);
  if ((sqlite3Config.bLocaltimeFault != 0) &&
     ((sqlite3Config.xAltLocaltime == (_func_int_void_ptr_void_ptr *)0x0 ||
      (iVar1 = (*sqlite3Config.xAltLocaltime)(t,pTm), mutex = (sqlite3_mutex *)pTm, iVar1 != 0)))) {
    mutex = (sqlite3_mutex *)0x0;
  }
  if (mutex != (sqlite3_mutex *)0x0) {
    memcpy(pTm,mutex,0x38);
  }
  sqlite3_mutex_leave(p);
  return (uint)(mutex == (sqlite3_mutex *)0x0);
}

Assistant:

static int osLocaltime(time_t *t, struct tm *pTm){
  int rc;
#if !HAVE_LOCALTIME_R && !HAVE_LOCALTIME_S
  struct tm *pX;
#if SQLITE_THREADSAFE>0
  sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
#endif
  sqlite3_mutex_enter(mutex);
  pX = localtime(t);
#ifndef SQLITE_UNTESTABLE
  if( sqlite3GlobalConfig.bLocaltimeFault ){
    if( sqlite3GlobalConfig.xAltLocaltime!=0
     && 0==sqlite3GlobalConfig.xAltLocaltime((const void*)t,(void*)pTm)
    ){
      pX = pTm;
    }else{
      pX = 0;
    }
  }
#endif
  if( pX ) *pTm = *pX;
#if SQLITE_THREADSAFE>0
  sqlite3_mutex_leave(mutex);
#endif
  rc = pX==0;
#else
#ifndef SQLITE_UNTESTABLE
  if( sqlite3GlobalConfig.bLocaltimeFault ){
    if( sqlite3GlobalConfig.xAltLocaltime!=0 ){
      return sqlite3GlobalConfig.xAltLocaltime((const void*)t,(void*)pTm);
    }else{
      return 1;
    }
  }
#endif
#if HAVE_LOCALTIME_R
  rc = localtime_r(t, pTm)==0;
#else
  rc = localtime_s(pTm, t);
#endif /* HAVE_LOCALTIME_R */
#endif /* HAVE_LOCALTIME_R || HAVE_LOCALTIME_S */
  return rc;
}